

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

double __thiscall test::stdev_ts(test *this)

{
  double dVar1;
  test *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  
  get_ts(in_stack_00000018);
  dVar1 = stdev<double>(in_stack_00000028);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffd0);
  return dVar1;
}

Assistant:

double stdev_ts() const { return ::stdev(get_ts()); }